

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usha.c
# Opt level: O1

int USHAHashSize(SHAversion whichSha)

{
  int iVar1;
  
  iVar1 = 0x40;
  if (whichSha < SHA512) {
    iVar1 = *(int *)(&DAT_00156720 + (ulong)whichSha * 4);
  }
  return iVar1;
}

Assistant:

int USHAHashSize(enum SHAversion whichSha)
{
    switch (whichSha) {
    case SHA1:   return SHA1HashSize;
    case SHA224: return SHA224HashSize;
    case SHA256: return SHA256HashSize;
    case SHA384: return SHA384HashSize;
    default:
    case SHA512: return SHA512HashSize;
    }
}